

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remove.c
# Opt level: O0

int main(void)

{
  obj *poVar1;
  obj *next_o;
  obj *o;
  int i;
  
  for (o._0_4_ = 0; (int)o < 1000; o._0_4_ = (int)o + 1) {
    data[(int)o].satelite = (int)o;
    data[(int)o].entry.succ = 0;
    data[(int)o].entry.pred = 0;
    data[(int)o].entry.refcnt = 0;
  }
  for (o._0_4_ = 0; (int)o < 1000; o._0_4_ = (int)o + 1) {
    ll_insert_tail_objlist(&list,data + (int)o);
  }
  o._0_4_ = 0;
  next_o = ll_first_objlist(&list);
  while( true ) {
    if (999 < (int)o) {
      ll_ref_objlist(&list,data);
      ll_unlink_objlist(&list,data);
      o._0_4_ = 1;
      next_o = ll_first_objlist(&list);
      while( true ) {
        if (999 < (int)o) {
          return 0;
        }
        if (next_o == (obj *)0x0) break;
        if (next_o->satelite != (int)o) {
          __assert_fail("o->satelite == i",
                        "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/test/remove.c"
                        ,0x25,"int main()");
        }
        poVar1 = ll_succ_objlist(&list,next_o);
        ll_release_objlist(&list,next_o);
        o._0_4_ = (int)o + 1;
        next_o = poVar1;
      }
      __assert_fail("o != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/test/remove.c"
                    ,0x24,"int main()");
    }
    if (next_o == (obj *)0x0) break;
    if (next_o->satelite != (int)o) {
      __assert_fail("o->satelite == i",
                    "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/test/remove.c"
                    ,0x18,"int main()");
    }
    poVar1 = ll_succ_objlist(&list,next_o);
    ll_release_objlist(&list,next_o);
    o._0_4_ = (int)o + 1;
    next_o = poVar1;
  }
  __assert_fail("o != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/test/remove.c",
                0x17,"int main()");
}

Assistant:

int
main()
{
	int i;
	struct obj *o, *next_o = NULL;

	for (i = 0; i < N; i++) {
		data[i].satelite = i;
		LL_INIT_ENTRY(&data[i].entry);
	}

	for (i = 0; i < N; i++)
		LL_PUSH_BACK(objlist, &list, &data[i]);

	for (i = 0, o = LL_FIRST(objlist, &list);
	    i < N;
	    i++, o = next_o) {
		assert(o != NULL);
		assert(o->satelite == i);

		next_o = LL_NEXT(objlist, &list, o);

		LL_RELEASE(objlist, &list, o);
	}

	LL_REF(objlist, &list, &data[0]);
	LL_UNLINK(objlist, &list, &data[0]);
	for (i = 1, o = LL_FIRST(objlist, &list);
	    i < N;
	    i++, o = next_o) {
		assert(o != NULL);
		assert(o->satelite == i);

		next_o = LL_NEXT(objlist, &list, o);

		LL_RELEASE(objlist, &list, o);
	}

	return 0;
}